

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O3

void __thiscall
Number_N10DefaultBase16_Test<char>::TestBody(Number_N10DefaultBase16_Test<char> *this)

{
  void *in_RDX;
  char *message;
  number_long v;
  AssertHelper local_80;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  internal local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  number_base local_20;
  undefined8 local_10;
  
  pstore::dump::number_base::default_base_ = 0x10;
  local_20.base_ = 0x10;
  local_20.super_value._vptr_value = (_func_int **)&PTR__number_base_001f2660;
  local_10 = 10;
  pstore::dump::value::write(&local_20.super_value,(int)this + 0x10,in_RDX,0x10);
  std::__cxx11::stringbuf::str();
  convert<char>(&local_60,"0xa");
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            (local_70,"expected","actual",&local_60,&local_40);
  if (local_70[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_78);
    if (local_68 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_68->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/dump/test_number.cpp"
               ,0x87,message);
    testing::internal::AssertHelper::operator=(&local_80,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper(&local_80);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_78._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_78._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_68 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_68,local_68);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pstore::dump::number_base::~number_base(&local_20);
  return;
}

Assistant:

TYPED_TEST (Number, N10DefaultBase16) {
    pstore::dump::number_base::hex ();
    pstore::dump::number_long v (10, 16);
    v.write (this->out_);
    auto const & actual = this->out_.str ();
    auto const & expected = convert<TypeParam> ("0xa");
    EXPECT_EQ (expected, actual);
}